

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cm.c
# Opt level: O0

CMConnection CMinternal_get_conn(CManager_conflict cm,attr_list attrs)

{
  FILE *pFVar1;
  int iVar2;
  __pid_t _Var3;
  long lVar4;
  pthread_t pVar5;
  attr_list in_RSI;
  CManager in_RDI;
  timespec ts_3;
  timespec ts_2;
  timespec ts_1;
  timespec ts;
  CMConnection tmp;
  int target_cm_id;
  CMConnection conn;
  int i;
  CMConnection in_stack_ffffffffffffff48;
  FILE *in_stack_ffffffffffffff50;
  undefined8 in_stack_ffffffffffffff88;
  CMTraceType trace_type;
  CManager in_stack_ffffffffffffff90;
  long local_68;
  timespec local_60;
  timespec local_50;
  timespec local_40;
  CMConnection local_30;
  int local_24;
  CMConnection local_20;
  int local_14;
  
  local_20 = (CMConnection)0x0;
  iVar2 = CManager_locked(in_RDI);
  if (iVar2 == 0) {
    __assert_fail("CManager_locked(cm)",
                  "/workspace/llm4binary/github/license_c_cmakelists/ornladios[P]ADIOS2/thirdparty/EVPath/EVPath/cm.c"
                  ,0x6a3,"CMConnection CMinternal_get_conn(CManager, attr_list)");
  }
  iVar2 = CMtrace_val[2];
  if (in_RDI->CMTrace_file == (FILE *)0x0) {
    iVar2 = CMtrace_init(in_stack_ffffffffffffff90,
                         (CMTraceType)((ulong)in_stack_ffffffffffffff88 >> 0x20));
  }
  if (iVar2 != 0) {
    fprintf((FILE *)in_RDI->CMTrace_file,"In CMinternal_get_conn, attrs ");
    if (in_RSI == (attr_list)0x0) {
      fprintf((FILE *)in_RDI->CMTrace_file,"\n");
    }
    else {
      fdump_attr_list(in_RDI->CMTrace_file,in_RSI);
    }
  }
  local_24 = -1;
  get_int_attr(in_RSI,CM_CMANAGER_ID,&local_24);
  local_14 = 0;
  do {
    trace_type = (CMTraceType)((ulong)in_stack_ffffffffffffff88 >> 0x20);
    if (in_RDI->connection_count <= local_14) {
LAB_0011e8ad:
      if (local_20 == (CMConnection)0x0) {
        iVar2 = CMtrace_val[2];
        if (in_RDI->CMTrace_file == (FILE *)0x0) {
          iVar2 = CMtrace_init(in_stack_ffffffffffffff90,trace_type);
        }
        if (iVar2 != 0) {
          fprintf((FILE *)in_RDI->CMTrace_file,
                  "In CMinternal_get_conn, no existing connection found, initiating\n");
        }
        local_20 = CMinternal_initiate_conn(in_RDI,in_RSI);
        if (local_20 != (CMConnection)0x0) {
          iVar2 = CMtrace_val[7];
          if (local_20->cm->CMTrace_file == (FILE *)0x0) {
            iVar2 = CMtrace_init(in_stack_ffffffffffffff90,trace_type);
          }
          if (iVar2 != 0) {
            if (CMtrace_PID != 0) {
              pFVar1 = (FILE *)local_20->cm->CMTrace_file;
              _Var3 = getpid();
              pVar5 = pthread_self();
              fprintf(pFVar1,"P%lxT%lx - ",(long)_Var3,pVar5);
            }
            if (CMtrace_timing != 0) {
              clock_gettime(1,&local_60);
              fprintf((FILE *)local_20->cm->CMTrace_file,"%lld.%.9ld - ",local_60.tv_sec,
                      local_60.tv_nsec);
            }
            fprintf((FILE *)local_20->cm->CMTrace_file,
                    "internal_get_conn initiated connection %p ref count now %d\n",local_20,
                    (ulong)(uint)local_20->conn_ref_count);
          }
          fflush((FILE *)local_20->cm->CMTrace_file);
        }
      }
      if (local_20 != (CMConnection)0x0) {
        iVar2 = CMtrace_val[7];
        if (local_20->cm->CMTrace_file == (FILE *)0x0) {
          iVar2 = CMtrace_init(in_stack_ffffffffffffff90,trace_type);
        }
        if (iVar2 != 0) {
          if (CMtrace_PID != 0) {
            in_stack_ffffffffffffff50 = (FILE *)local_20->cm->CMTrace_file;
            _Var3 = getpid();
            pVar5 = pthread_self();
            fprintf(in_stack_ffffffffffffff50,"P%lxT%lx - ",(long)_Var3,pVar5);
          }
          if (CMtrace_timing != 0) {
            clock_gettime(1,(timespec *)&stack0xffffffffffffff90);
            fprintf((FILE *)local_20->cm->CMTrace_file,"%lld.%.9ld - ",in_stack_ffffffffffffff90,
                    local_68);
          }
          fprintf((FILE *)local_20->cm->CMTrace_file,
                  "internal_get_conn returning conn=%p ref count %d\n",local_20,
                  (ulong)(uint)local_20->conn_ref_count);
        }
        fflush((FILE *)local_20->cm->CMTrace_file);
      }
      iVar2 = CMtrace_val[2];
      if (in_RDI->CMTrace_file == (FILE *)0x0) {
        iVar2 = CMtrace_init(in_stack_ffffffffffffff90,trace_type);
      }
      if (iVar2 != 0) {
        fprintf((FILE *)in_RDI->CMTrace_file,"CMinternal_get_conn returning ");
        if (local_20 == (CMConnection)0x0) {
          fprintf((FILE *)in_RDI->CMTrace_file,"NULL\n");
        }
        else {
          fdump_CMConnection((FILE *)in_stack_ffffffffffffff50,in_stack_ffffffffffffff48);
        }
      }
      return local_20;
    }
    local_30 = in_RDI->connections[local_14];
    if ((local_30->closed == 0) && (local_30->failed == 0)) {
      if (local_30->remote_CManager_ID != local_24) {
        iVar2 = (*local_30->trans->connection_eq)
                          (in_RDI,&CMstatic_trans_svcs,local_30->trans,in_RSI,
                           local_30->transport_data);
        trace_type = (CMTraceType)((ulong)in_stack_ffffffffffffff88 >> 0x20);
        if (iVar2 == 0) goto LAB_0011e897;
      }
      iVar2 = CMtrace_val[7];
      if (local_30->cm->CMTrace_file == (FILE *)0x0) {
        iVar2 = CMtrace_init(in_stack_ffffffffffffff90,trace_type);
      }
      if (iVar2 != 0) {
        if (CMtrace_PID != 0) {
          pFVar1 = (FILE *)local_30->cm->CMTrace_file;
          _Var3 = getpid();
          lVar4 = (long)_Var3;
          pVar5 = pthread_self();
          fprintf(pFVar1,"P%lxT%lx - ",lVar4,pVar5);
          trace_type = (CMTraceType)((ulong)lVar4 >> 0x20);
        }
        if (CMtrace_timing != 0) {
          clock_gettime(1,&local_40);
          fprintf((FILE *)local_30->cm->CMTrace_file,"%lld.%.9ld - ",local_40.tv_sec,
                  local_40.tv_nsec);
        }
        fprintf((FILE *)local_30->cm->CMTrace_file,
                "internal_get_conn found conn=%p ref count will be %d\n",local_30,
                (ulong)(local_30->conn_ref_count + 1));
      }
      fflush((FILE *)local_30->cm->CMTrace_file);
      iVar2 = CMtrace_val[2];
      if (local_30->cm->CMTrace_file == (FILE *)0x0) {
        iVar2 = CMtrace_init(in_stack_ffffffffffffff90,trace_type);
      }
      if (iVar2 != 0) {
        if (CMtrace_PID != 0) {
          pFVar1 = (FILE *)local_30->cm->CMTrace_file;
          _Var3 = getpid();
          pVar5 = pthread_self();
          fprintf(pFVar1,"P%lxT%lx - ",(long)_Var3,pVar5);
        }
        if (CMtrace_timing != 0) {
          clock_gettime(1,&local_50);
          fprintf((FILE *)local_30->cm->CMTrace_file,"%lld.%.9ld - ",local_50.tv_sec,
                  local_50.tv_nsec);
        }
        fprintf((FILE *)local_30->cm->CMTrace_file,
                "internal_get_conn found conn=%p ref count will be %d\n",local_30,
                (ulong)(local_30->conn_ref_count + 1));
      }
      fflush((FILE *)local_30->cm->CMTrace_file);
      local_30->conn_ref_count = local_30->conn_ref_count + 1;
      local_20 = local_30;
      goto LAB_0011e8ad;
    }
LAB_0011e897:
    local_14 = local_14 + 1;
  } while( true );
}

Assistant:

CMConnection
 CMinternal_get_conn(CManager cm, attr_list attrs)
 {
     int i;
     CMConnection conn = NULL;
     assert(CManager_locked(cm));
     if (CMtrace_on(cm, CMConnectionVerbose)) {
	 fprintf(cm->CMTrace_file, "In CMinternal_get_conn, attrs ");
	 if (attrs) fdump_attr_list(cm->CMTrace_file, attrs); else fprintf(cm->CMTrace_file, "\n");
     }
     int target_cm_id = -1;
     (void) get_int_attr(attrs, CM_CMANAGER_ID, &target_cm_id);
     for (i=0; i<cm->connection_count; i++) {
	 CMConnection tmp = cm->connections[i];
	 if (tmp->closed || tmp->failed) continue;

	 if ((tmp->remote_CManager_ID == target_cm_id) ||
	     tmp->trans->connection_eq(cm, &CMstatic_trans_svcs,
				       tmp->trans, attrs,
				       tmp->transport_data)) {

	     CMtrace_out(tmp->cm, CMFreeVerbose, "internal_get_conn found conn=%p ref count will be %d\n", 
			 tmp, tmp->conn_ref_count +1);
	     CMtrace_out(tmp->cm, CMConnectionVerbose, "internal_get_conn found conn=%p ref count will be %d\n", 
			 tmp, tmp->conn_ref_count +1);
	     tmp->conn_ref_count++;
	     conn = tmp;
	     break;
	 }
     }
     if (conn == NULL) {
	 if (CMtrace_on(cm, CMConnectionVerbose)) {
	     fprintf(cm->CMTrace_file, "In CMinternal_get_conn, no existing connection found, initiating\n");
	 }
	 conn = CMinternal_initiate_conn(cm, attrs);
	 if (conn) {
	     CMtrace_out(conn->cm, CMFreeVerbose, "internal_get_conn initiated connection %p ref count now %d\n", 
			 conn, conn->conn_ref_count);
	 }
     }
     if (conn != NULL) {
	 CMtrace_out(conn->cm, CMFreeVerbose, "internal_get_conn returning conn=%p ref count %d\n", 
		     conn, conn->conn_ref_count);
     }
     if (CMtrace_on(cm, CMConnectionVerbose)) {
	 fprintf(cm->CMTrace_file, "CMinternal_get_conn returning ");
	 if (conn != NULL) {
	     fdump_CMConnection(cm->CMTrace_file, conn);
	 } else {
	     fprintf(cm->CMTrace_file, "NULL\n");
	 }
     }
     return conn;
 }